

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int get_int_const(gen_ctx_t gen_ctx,MIR_op_t *op_ref,int64_t *c)

{
  long lVar1;
  uint uVar2;
  uint64_t uVar3;
  
  uVar2 = (uint)(byte)op_ref->field_0x8;
  if (op_ref->field_0x8 == 2) {
    if (op_ref->data == (void *)0x0) {
      return 0;
    }
    lVar1 = **(long **)((long)op_ref->data + 8);
    if (*(int *)(lVar1 + 0x18) != 0) {
      return 0;
    }
    uVar2 = (uint)*(ushort *)(lVar1 + 0x58);
    op_ref = (MIR_op_t *)(lVar1 + 0x50);
  }
  if ((uVar2 & 0xff) - 3 < 2) {
    uVar3 = (op_ref->u).i;
  }
  else {
    if ((uVar2 & 0xff) != 8) {
      return 0;
    }
    if (((op_ref->u).ref)->item_type == MIR_func_item) {
      return 0;
    }
    uVar3 = get_ref_value(gen_ctx,op_ref);
  }
  *c = uVar3;
  return 1;
}

Assistant:

static int get_int_const (gen_ctx_t gen_ctx, MIR_op_t *op_ref, int64_t *c) {
  if (op_ref->mode == MIR_OP_VAR) {
    ssa_edge_t se = op_ref->data;
    if (se == NULL || se->def->insn->code != MIR_MOV) return FALSE;
    op_ref = &se->def->insn->ops[1];
  }
  if (op_ref->mode == MIR_OP_INT || op_ref->mode == MIR_OP_UINT) {
    *c = op_ref->u.i;
  } else if (op_ref->mode == MIR_OP_REF && op_ref->u.ref->item_type != MIR_func_item) {
    *c = get_ref_value (gen_ctx, op_ref);
  } else {
    return FALSE;
  }
  return TRUE;
}